

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_reader.c
# Opt level: O0

void dtl_json_readerData_create(dtl_json_readerData_t *self)

{
  dtl_json_readerData_t *self_local;
  
  if (self != (dtl_json_readerData_t *)0x0) {
    self->currentElem = (dtl_dv_t *)0x0;
    self->parentElem = (dtl_dv_t *)0x0;
    self->isArray = false;
    self->isObject = false;
    adt_str_create(&self->objectKey);
  }
  return;
}

Assistant:

static void dtl_json_readerData_create(dtl_json_readerData_t *self)
{
   if (self != 0)
   {
      self->currentElem = (dtl_dv_t*) 0;
      self->parentElem = (dtl_dv_t*) 0;
      self->isArray = false;
      self->isObject = false;
      adt_str_create(&self->objectKey);
   }
}